

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::Square(Bignum *this)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint *puVar8;
  int bigit_index1;
  long lVar9;
  long lVar10;
  uint *puVar11;
  bool bVar12;
  
  iVar1 = this->used_digits_;
  lVar4 = (long)iVar1;
  if (0x40 < lVar4) {
    abort();
  }
  uVar3 = iVar1 * 2;
  if (iVar1 < 1) {
    uVar5 = 0;
    iVar7 = iVar1;
  }
  else {
    puVar2 = (this->bigits_).start_;
    lVar6 = 0;
    do {
      puVar2[lVar4 + lVar6] = puVar2[lVar6];
      lVar6 = lVar6 + 1;
      iVar7 = this->used_digits_;
    } while (lVar6 < iVar7);
    if (iVar7 < 1) {
      uVar5 = 0;
    }
    else {
      puVar11 = (this->bigits_).start_;
      puVar2 = puVar11 + lVar4;
      lVar9 = 0;
      uVar5 = 0;
      puVar8 = puVar2;
      lVar6 = lVar9;
      do {
        do {
          uVar5 = uVar5 + (ulong)*puVar8 * (ulong)puVar2[lVar9];
          bVar12 = lVar9 != 0;
          lVar9 = lVar9 + -1;
          puVar8 = puVar8 + 1;
        } while (bVar12);
        puVar11[lVar6] = (uint)uVar5 & 0xfffffff;
        uVar5 = uVar5 >> 0x1c;
        lVar9 = lVar6 + 1;
        iVar7 = this->used_digits_;
        puVar8 = puVar2;
        lVar6 = lVar9;
      } while (lVar9 < iVar7);
    }
  }
  if (SBORROW4(iVar7,uVar3) != iVar7 + iVar1 * -2 < 0) {
    puVar2 = (this->bigits_).start_;
    lVar6 = (long)iVar7;
    do {
      lVar9 = lVar6 + 1;
      iVar7 = this->used_digits_;
      if (((int)lVar6 - iVar7) + 1 < iVar7) {
        lVar10 = (long)((int)lVar9 - iVar7);
        puVar11 = puVar2 + lVar4 + iVar7;
        do {
          puVar11 = puVar11 + -1;
          uVar5 = uVar5 + (ulong)puVar2[lVar4 + lVar10] * (ulong)*puVar11;
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar7);
      }
      puVar2[lVar6] = (uint)uVar5 & 0xfffffff;
      uVar5 = uVar5 >> 0x1c;
      lVar6 = lVar9;
    } while (lVar9 != (int)uVar3);
  }
  this->exponent_ = this->exponent_ << 1;
  this->used_digits_ = uVar3;
  if (0 < iVar1) {
    puVar2 = (this->bigits_).start_;
    uVar5 = (ulong)uVar3 + 1;
    do {
      uVar3 = uVar3 - 1;
      if (puVar2[uVar5 - 2] != 0) {
        return;
      }
      this->used_digits_ = uVar3;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  if (uVar3 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::Square() {
  ASSERT(IsClamped());
  int product_length = 2 * used_digits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_digits_) {
    UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  int copy_offset = used_digits_;
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[copy_offset + i] = bigits_[i];
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_digits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_digits_; i < product_length; ++i) {
    int bigit_index1 = used_digits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_digits_) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten bigits_[i] will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_digits_.
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_digits_ = product_length;
  exponent_ *= 2;
  Clamp();
}